

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O2

void __thiscall
Function_Pool::AreaInfo::_calculate
          (AreaInfo *this,uint32_t x,uint32_t y,uint32_t width_,uint32_t height_,uint32_t count)

{
  uint uVar1;
  
  uVar1 = 1;
  if (0xf < width_) {
    uVar1 = width_ >> 4;
  }
  if (count <= uVar1) {
    uVar1 = count;
  }
  if (height_ < count) {
    count = height_;
  }
  if (count <= uVar1) {
    count = uVar1;
  }
  _fill(this,x,y,width_,height_,count,uVar1 <= height_);
  return;
}

Assistant:

void AreaInfo::_calculate( uint32_t x, uint32_t y, uint32_t width_, uint32_t height_, uint32_t count )
    {
        uint32_t maximumXTaskCount = width_ / cacheSize;
        if( maximumXTaskCount == 0 )
            maximumXTaskCount = 1;
        if( maximumXTaskCount > count )
            maximumXTaskCount = count;

        uint32_t maximumYTaskCount = height_;
        if( maximumYTaskCount > count )
            maximumYTaskCount = count;

        count = (maximumYTaskCount >= maximumXTaskCount) ? maximumYTaskCount : maximumXTaskCount;

        _fill( x, y, width_, height_, count, maximumYTaskCount >= maximumXTaskCount );
    }